

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Feature.cpp
# Opt level: O2

void __thiscall jbcoin::detail::FeatureCollections::FeatureCollections(FeatureCollections *this)

{
  char *__s;
  size_t size;
  mapped_type *pmVar1;
  mapped_type *this_00;
  mapped_type mVar2;
  undefined **ppuVar3;
  allocator local_161;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *local_160;
  flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
  *local_158;
  FeatureCollections *local_150;
  key_type local_148;
  uint256 f;
  sha512_half_hasher h;
  
  local_158 = &this->featureToIndex;
  local_160 = &this->nameToFeature;
  (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (this->features).
  super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->featureToIndex).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (this->features).
  super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->features).
  super__Vector_base<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nameToFeature).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  local_150 = this;
  std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
  reserve(&this->features,0x17);
  boost::container::
  vector<boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>,_boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>_>,_void>
  ::reserve((vector<boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>,_boost::container::new_allocator<boost::container::dtl::pair<jbcoin::base_uint<256UL,_void>,_unsigned_long>_>,_void>
             *)local_158,0x17);
  boost::container::
  vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>_>,_void>
  ::reserve((vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>_>_>,_void>
             *)local_160,0x17);
  ppuVar3 = &featureNames;
  for (mVar2 = 0; mVar2 != 0x17; mVar2 = mVar2 + 1) {
    __s = *ppuVar3;
    SHA512_Init((SHA512_CTX *)&h);
    size = strlen(__s);
    openssl_sha512_hasher::operator()((openssl_sha512_hasher *)&h,__s,size);
    basic_sha512_half_hasher::operator_cast_to_base_uint(&f,(basic_sha512_half_hasher *)&h);
    std::vector<jbcoin::base_uint<256UL,_void>,_std::allocator<jbcoin::base_uint<256UL,_void>_>_>::
    push_back(&local_150->features,&f);
    pmVar1 = boost::container::
             flat_map<jbcoin::base_uint<256UL,_void>,_unsigned_long,_std::less<jbcoin::base_uint<256UL,_void>_>,_void>
             ::priv_subscript(local_158,&f);
    *pmVar1 = mVar2;
    std::__cxx11::string::string((string *)&local_148,__s,&local_161);
    this_00 = boost::container::
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jbcoin::base_uint<256UL,_void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              ::priv_subscript(local_160,&local_148);
    base_uint<256UL,_void>::operator=(this_00,&f);
    std::__cxx11::string::~string((string *)&local_148);
    ppuVar3 = ppuVar3 + 1;
  }
  return;
}

Assistant:

detail::FeatureCollections::FeatureCollections()
{
    features.reserve(numFeatures());
    featureToIndex.reserve(numFeatures());
    nameToFeature.reserve(numFeatures());

    for (std::size_t i = 0; i < numFeatures(); ++i)
    {
        auto const name = featureNames[i];
        sha512_half_hasher h;
        h (name, std::strlen (name));
        auto const f = static_cast<uint256>(h);

        features.push_back(f);
        featureToIndex[f] = i;
        nameToFeature[name] = f;
    }
}